

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  MMS MVar1;
  int32_t iVar2;
  int iVar3;
  code *pcVar4;
  cTValue *pcVar5;
  TValue *pTVar6;
  cTValue *o1_00;
  cTValue *o2_00;
  bool bVar7;
  uint local_8c;
  cTValue *local_88;
  cTValue *ot;
  cTValue *mo2;
  cTValue *mo_1;
  MMS mm_1;
  ASMFunction cont_1;
  int32_t res;
  cTValue *mo;
  MMS mm;
  ASMFunction cont;
  cTValue *pcStack_28;
  int op_local;
  cTValue *o2_local;
  cTValue *o1_local;
  lua_State *L_local;
  
  pcStack_28 = o2;
  o2_local = o1;
  if (((int)(o1->field_4).it >> 0xf == -0xb) || ((int)(o2->field_4).it >> 0xf == -0xb)) {
    pcVar4 = lj_cont_condt;
    if ((op & 1U) != 0) {
      pcVar4 = lj_cont_condf;
    }
    MVar1 = MM_lt;
    if ((op & 2U) != 0) {
      MVar1 = MM_le;
    }
    local_88 = o2;
    if ((int)(o1->field_4).it >> 0xf == -0xb) {
      local_88 = o1;
    }
    pcVar5 = lj_meta_lookup(L,local_88,MVar1);
    if (pcVar5->u64 != 0xffffffffffffffff) {
      pTVar6 = mmcall(L,pcVar4,pcVar5,o1,o2);
      return pTVar6;
    }
  }
  else {
    cont._4_4_ = op;
    if ((int)(o1->field_4).it >> 0xf == (int)(o2->field_4).it >> 0xf) {
      if (((int)(o1->field_4).it >> 0xf == -5) && ((int)(o2->field_4).it >> 0xf == -5)) {
        iVar2 = lj_str_cmp((GCstr *)(o1->u64 & 0x7fffffffffff),(GCstr *)(o2->u64 & 0x7fffffffffff));
        if ((op & 2U) == 0) {
          bVar7 = iVar2 < 0;
        }
        else {
          bVar7 = iVar2 < 1;
        }
        local_8c = (uint)bVar7;
        return (TValue *)(long)(int)(local_8c ^ op & 1U);
      }
    }
    else if ((((int)(o1->field_4).it >> 0xf != -2) && ((int)(o1->field_4).it >> 0xf != -3)) ||
            (((int)(o2->field_4).it >> 0xf != -2 && ((int)(o2->field_4).it >> 0xf != -3))))
    goto LAB_00149296;
    while( true ) {
      pcVar5 = o2_local;
      pcVar4 = lj_cont_condt;
      if ((cont._4_4_ & 1) != 0) {
        pcVar4 = lj_cont_condf;
      }
      MVar1 = MM_lt;
      if ((cont._4_4_ & 2) != 0) {
        MVar1 = MM_le;
      }
      o1_00 = lj_meta_lookup(L,o2_local,MVar1);
      o2_00 = lj_meta_lookup(L,pcStack_28,MVar1);
      if ((o1_00->u64 != 0xffffffffffffffff) && (iVar3 = lj_obj_equal(o1_00,o2_00), iVar3 != 0)) {
        pTVar6 = mmcall(L,pcVar4,o1_00,o2_local,pcStack_28);
        return pTVar6;
      }
      if ((cont._4_4_ & 2) == 0) break;
      o2_local = pcStack_28;
      pcStack_28 = pcVar5;
      cont._4_4_ = cont._4_4_ ^ 3;
    }
  }
LAB_00149296:
  lj_err_comp(L,o2_local,pcStack_28);
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}